

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O2

void __thiscall Server::sendFriendList(Server *this)

{
  uint32_t friendNumber;
  Tox *pTVar1;
  long lVar2;
  ulong uVar3;
  int i;
  ulong uVar4;
  bool bVar5;
  bool bVar6;
  undefined8 uStack_80;
  uint32_t auStack_78 [2];
  ulong local_70;
  undefined1 *local_68;
  string local_60;
  int local_40;
  TOX_ERR_FRIEND_SEND_MESSAGE local_3c;
  TOX_ERR_FRIEND_SEND_MESSAGE sendError;
  allocator local_31;
  
  uStack_80 = 0x10a7c6;
  uVar3 = tox_self_get_friend_list_size(this->tox);
  if (uVar3 < 2) {
    uStack_80 = 0x10a86a;
    tox_friend_send_message(this->tox,this->redirectionFriendNumber,0,"32",2,&local_40);
    if (local_40 == 0) {
      uStack_80 = 0x10a8d5;
      std::__cxx11::string::string((string *)&local_60,"Sent empty friend list message",&local_31);
      uStack_80 = 0x10a8e1;
      writeToLog(this,&local_60);
    }
    else {
      uStack_80 = 0x10a884;
      std::__cxx11::string::string
                ((string *)&local_60,"Failed to send empty friend list message",&local_31);
      uStack_80 = 0x10a890;
      writeToLog(this,&local_60);
    }
    uStack_80 = 0x10a8ea;
    std::__cxx11::string::~string((string *)&local_60);
  }
  else {
    lVar2 = -(uVar3 * 4 + 0xf & 0xfffffffffffffff0);
    pTVar1 = this->tox;
    local_68 = (undefined1 *)auStack_78;
    *(undefined8 *)((long)auStack_78 + lVar2 + -8) = 0x10a7f3;
    tox_self_get_friend_list(pTVar1,(long)auStack_78 + lVar2);
    local_70 = uVar3 - 1;
    local_3c = *(TOX_ERR_FRIEND_SEND_MESSAGE *)((long)auStack_78 + uVar3 * 4 + lVar2 + -4);
    sendError = this->redirectionFriendNumber;
    for (uVar4 = 0; uVar3 != uVar4; uVar4 = uVar4 + 1) {
      friendNumber = *(uint32_t *)((long)auStack_78 + lVar2 + uVar4 * 4);
      if (friendNumber != this->redirectionFriendNumber) {
        bVar5 = local_3c == sendError;
        bVar6 = local_70 == uVar4;
        *(undefined8 *)((long)auStack_78 + lVar2 + -8) = 0x10a846;
        sendFriendUpdate(this,friendNumber,(uVar3 - 2 == uVar4 && bVar5 || bVar6) | FRIENDLIST_ITEM)
        ;
      }
    }
    *(undefined8 *)((long)auStack_78 + lVar2 + -8) = 0x10a8a6;
    std::__cxx11::string::string((string *)&local_60,"Sent friend list",(allocator *)&local_40);
    *(undefined8 *)((long)auStack_78 + lVar2 + -8) = 0x10a8b2;
    writeToLog(this,&local_60);
    *(undefined8 *)((long)auStack_78 + lVar2 + -8) = 0x10a8bb;
    std::__cxx11::string::~string((string *)&local_60);
  }
  return;
}

Assistant:

void Server::sendFriendList() {
    size_t friendCount = tox_self_get_friend_list_size(tox);

    if (friendCount > 1) { //When friendCount == 1, the only friend which exists is the client
        uint32_t friendList[friendCount];
        tox_self_get_friend_list(tox, friendList);

        bool redirectionIsLast = (friendList[friendCount - 1] == redirectionFriendNumber);

        for (int i = 0; i < friendCount; i++) {
            uint32_t friendNumber = friendList[i];

            if (friendNumber != redirectionFriendNumber) {
                sendFriendUpdate(friendNumber, (i == friendCount - 1 || (redirectionIsLast && i == friendCount - 2)) ? FRIENDLIST_END : FRIENDLIST_ITEM);
            }
        }

        writeToLog("Sent friend list");
    } else {
        TOX_ERR_FRIEND_SEND_MESSAGE sendError;
        tox_friend_send_message(tox, redirectionFriendNumber, TOX_MESSAGE_TYPE_NORMAL, (uint8_t *) "32", 2, &sendError);

        bool success = (sendError == TOX_ERR_FRIEND_SEND_MESSAGE_OK);

        if (success) {
            writeToLog("Sent empty friend list message");
        } else {
            writeToLog("Failed to send empty friend list message");
        }
    }
}